

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O1

int __thiscall pele::physics::turbinflow::TurbInflow::init(TurbInflow *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  pointer pTVar1;
  ulong uVar2;
  char cVar3;
  uint uVar4;
  Side SVar5;
  int extraout_EAX;
  istream *piVar6;
  istream *piVar7;
  FArrayBox *this_01;
  Arena *ar;
  int *ptr;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  Array<int,_3> npts;
  Vector<double,_std::allocator<double>_> turb_center;
  Array<int,_3> iper;
  string turb_header;
  Array<amrex::Real,_3> probsize;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tp_list;
  string side;
  Real rdummy;
  ParmParse pp;
  ParmParse ppr;
  ifstream is;
  int local_3e0 [4];
  ulong local_3d0;
  vector<double,_std::allocator<double>_> local_3c8;
  int local_3a8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  double local_358 [4];
  ulong local_338;
  long local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  string local_310;
  undefined8 local_2f0;
  ParmParse local_2e8;
  ParmParse local_290;
  undefined1 local_238 [24];
  undefined8 auStack_220 [62];
  
  local_238._8_8_ = (ostream *)0x0;
  local_238[0x10] = '\0';
  local_238._0_8_ = local_238 + 0x10;
  amrex::ParmParse::ParmParse(&local_290,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
  }
  uVar4 = amrex::ParmParse::countval(&local_290,"turbinflows",-1);
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = (ulong)uVar4;
  local_3d0 = CONCAT44(local_3d0._4_4_,uVar4);
  local_338 = uVar11;
  if (0 < (int)uVar4) {
    std::
    vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
    ::resize((vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
              *)this,uVar11);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_328,uVar11);
    lVar8 = 0;
    iVar10 = 0;
    do {
      amrex::ParmParse::get
                (&local_290,"turbinflows",
                 (string *)
                 ((long)&((local_328.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 iVar10);
      iVar10 = iVar10 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar11 << 5 != lVar8);
  }
  if (0 < (int)local_3d0) {
    local_330 = 0x60;
    uVar11 = 0;
    do {
      local_3d0 = uVar11;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     "turbinflow.",
                     local_328.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11);
      amrex::ParmParse::ParmParse(&local_2e8,(string *)local_238);
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
      }
      iVar10 = amrex::ParmParse::countval(&local_2e8,"turb_file",-1);
      uVar2 = local_3d0;
      if (0 < iVar10) {
        amrex::ParmParse::query
                  (&local_2e8,"turb_file",
                   &(this->tp).
                    super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    .
                    super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_3d0].m_turb_file,0);
        ptr = (int *)((long)((this->tp).
                             super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             .
                             super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0x90);
        *ptr = -1;
        amrex::ParmParse::query(&local_2e8,"dir",ptr,0);
        local_310._M_string_length = 0;
        local_310.field_2._M_local_buf[0] = '\0';
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        amrex::ParmParse::query(&local_2e8,"side",&local_310,0);
        iVar10 = std::__cxx11::string::compare((char *)&local_310);
        if (iVar10 == 0) {
          SVar5 = low;
LAB_003e1273:
          *(Side *)((long)((this->tp).
                           super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                           .
                           super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0x94) = SVar5;
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)&local_310);
          if (iVar10 == 0) {
            SVar5 = high;
            goto LAB_003e1273;
          }
          amrex::Abort_host("turbinflow.side can only be low or high");
        }
        amrex::ParmParse::query
                  (&local_2e8,"time_offset",
                   (Real *)((long)((this->tp).
                                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   .
                                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0x98),0);
        amrex::ParmParse::query
                  (&local_2e8,"turb_scale_loc",
                   (Real *)((long)((this->tp).
                                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   .
                                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar2) + 200),0);
        amrex::ParmParse::query
                  (&local_2e8,"turb_scale_vel",
                   (Real *)((long)((this->tp).
                                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   .
                                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0xd0),0);
        local_238._8_8_ = amrex::OutStream();
        this_00 = (ostringstream *)(local_238 + 0x10);
        local_238._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_238._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream(this_00);
        *(undefined8 *)
         ((long)auStack_220 + *(long *)(CONCAT71(local_238._17_7_,local_238[0x10]) + -0x18)) =
             *(undefined8 *)(local_238._8_8_ + *(long *)(*(long *)local_238._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Initializing turbInflow ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   local_328.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                   local_328.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," with file ",0xb);
        pTVar1 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,*(char **)&pTVar1[uVar2].m_turb_file,
                   *(size_type *)((long)(pTVar1 + uVar2) + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," (location coordinates in will be scaled by ",0x2c);
        std::ostream::_M_insert<double>
                  (*(Real *)((long)((this->tp).
                                    super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                    .
                                    super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar2) + 200));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," and velocity out to be scaled by ",0x22);
        std::ostream::_M_insert<double>
                  (*(Real *)((long)((this->tp).
                                    super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                    .
                                    super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0xd0));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") \n",3);
        amrex::Print::~Print((Print *)local_238);
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 2;
        *local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 0.0;
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[1] = 0.0;
        local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        amrex::ParmParse::getarr(&local_2e8,"turb_center",&local_3c8,0,-1);
        lVar8 = (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        if (0 < lVar8) {
          pTVar1 = (this->tp).
                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   .
                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = 0;
          do {
            local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9] =
                 *(Real *)((long)(pTVar1 + uVar2) + 200) *
                 local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
        }
        amrex::ParmParse::query
                  (&local_2e8,"turb_nplane",
                   (int *)((long)((this->tp).
                                  super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                  .
                                  super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0xa0),0);
        amrex::ParmParse::query
                  (&local_2e8,"turb_conv_vel",
                   (Real *)((long)((this->tp).
                                   super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   .
                                   super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0xd8),0);
        pTVar1 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        lVar8 = *(long *)&pTVar1[uVar2].m_turb_file;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_378,lVar8,*(size_type *)((long)(pTVar1 + uVar2) + 8) + lVar8);
        std::__cxx11::string::append((char *)&local_378);
        std::ifstream::ifstream((Print *)local_238,local_378._M_dataplus._M_p,_S_in);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          std::operator+(&local_398,"Unable to open input file ",&local_378);
          amrex::Abort(&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,
                            CONCAT44(local_398.field_2._M_allocated_capacity._4_4_,
                                     local_398.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        local_3e0[2] = 0;
        local_3e0[0] = 0;
        local_3e0[1] = 0;
        local_358[2] = 0.0;
        local_358[0] = 0.0;
        local_358[1] = 0.0;
        local_3a8[2] = 0;
        local_3a8[0] = 0;
        local_3a8[1] = 0;
        piVar6 = (istream *)std::istream::operator>>((istream *)local_238,local_3e0);
        piVar6 = (istream *)std::istream::operator>>(piVar6,local_3e0 + 1);
        std::istream::operator>>(piVar6,local_3e0 + 2);
        piVar7 = std::istream::_M_extract<double>((double *)local_238);
        piVar7 = std::istream::_M_extract<double>((double *)piVar7);
        std::istream::_M_extract<double>((double *)piVar7);
        piVar6 = (istream *)std::istream::operator>>((istream *)local_238,local_3a8);
        piVar6 = (istream *)std::istream::operator>>(piVar6,local_3a8 + 1);
        std::istream::operator>>(piVar6,local_3a8 + 2);
        pTVar1 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = 0;
        do {
          dVar12 = local_358[lVar8] / (double)(local_3e0[lVar8] + -1);
          *(double *)((long)&pTVar1->npboxcells + lVar8 * 8 + local_330 + 0xffffffffffffffc8U) =
               dVar12;
          *(double *)((long)&pTVar1->npboxcells + lVar8 * 8 + local_330 + 0xffffffffffffffe0U) =
               1.0 / dVar12;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        pTVar1 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar12 = local_358[0] -
                 (*(double *)((long)(pTVar1 + uVar2) + 0x48) +
                 *(double *)((long)(pTVar1 + uVar2) + 0x48));
        *(double *)((long)(pTVar1 + uVar2) + 0x78) = dVar12;
        dVar13 = local_358[1] -
                 (*(double *)((long)(pTVar1 + uVar2) + 0x50) +
                 *(double *)((long)(pTVar1 + uVar2) + 0x50));
        *(double *)((long)(pTVar1 + uVar2) + 0x80) = dVar13;
        *(double *)((long)(pTVar1 + uVar2) + 0x88) = local_358[2];
        *(int *)((long)(pTVar1 + uVar2) + 0x20) = local_3e0[0] + -3;
        *(int *)((long)(pTVar1 + uVar2) + 0x24) = local_3e0[1] + -3;
        *(int *)((long)(pTVar1 + uVar2) + 0x28) = local_3e0[2];
        *(double *)((long)(pTVar1 + uVar2) + 0x30) =
             dVar12 * -0.5 +
             *local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
        *(double *)((long)(pTVar1 + uVar2) + 0x38) =
             dVar13 * -0.5 +
             local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
        *(double *)((long)(pTVar1 + uVar2) + 0x40) = 0.0;
        local_398.field_2._M_allocated_capacity._4_4_ = *(int *)((long)(pTVar1 + uVar2) + 0xa0);
        local_398._M_dataplus._M_p = (pointer)0x100000001;
        local_398._M_string_length._0_4_ = 1;
        local_398.field_2._8_4_ = 0;
        local_398._M_string_length._4_4_ = local_3e0[0];
        local_398.field_2._M_allocated_capacity._0_4_ = local_3e0[1];
        this_01 = (FArrayBox *)operator_new(0x48);
        ar = amrex::The_Async_Arena();
        amrex::FArrayBox::FArrayBox(this_01,(Box *)&local_398,3,ar);
        pTVar1 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(FArrayBox **)((long)(pTVar1 + uVar2) + 0xa8) = this_01;
        *(int *)((long)(pTVar1 + uVar2) + 0xf8) = local_3e0[2];
        if ((*(bool *)((long)(pTVar1 + uVar2) + 0xc0) == true) &&
           (0 < *(int *)((long)((this->tp).
                                super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                .
                                super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0xf8))) {
          iVar10 = 0;
          do {
            local_2f0 = 0;
            std::istream::_M_extract<double>((double *)local_238);
            iVar10 = iVar10 + 1;
          } while (iVar10 < *(int *)((long)((this->tp).
                                            super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                            .
                                            super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar2) +
                                    0xf8));
        }
        pTVar1 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<long,_std::allocator<long>_>::resize
                  ((vector<long,_std::allocator<long>_> *)((long)(pTVar1 + uVar2) + 0xe0),
                   (long)*(int *)((long)(pTVar1 + uVar2) + 0xf8) * 3);
        pTVar1 = (this->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(long **)((long)(pTVar1 + uVar2) + 0x100) = *(long **)((long)(pTVar1 + uVar2) + 0xe0);
        *(long *)((long)(pTVar1 + uVar2) + 0x108) =
             (long)*(pointer *)((long)(pTVar1 + uVar2) + 0xe8) -
             (long)*(long **)((long)(pTVar1 + uVar2) + 0xe0) >> 3;
        if (0 < *(long *)((long)((this->tp).
                                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 .
                                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0x108)) {
          lVar8 = 0;
          do {
            std::istream::_M_extract<long>((long *)local_238);
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(long *)((long)((this->tp).
                                            super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                            .
                                            super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar2) +
                                    0x108));
        }
        std::ifstream::close();
        std::ifstream::~ifstream((Print *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,
                          CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                                   local_310.field_2._M_local_buf[0]) + 1);
        }
      }
      this->turbinflow_initialized = true;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2e8);
      uVar11 = local_3d0 + 1;
      local_330 = local_330 + 0x110;
    } while (uVar11 != local_338);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_290);
  return extraout_EAX;
}

Assistant:

void
TurbInflow::init(amrex::Geometry const& /*geom*/)
{
  amrex::ParmParse ppr;

  int n_tp = 0;
  n_tp = ppr.countval("turbinflows");
  amrex::Vector<std::string> tp_list;
  if (n_tp > 0) {
    tp.resize(n_tp);
    tp_list.resize(n_tp);
    for (int n = 0; n < n_tp; n++) {
      ppr.get("turbinflows", tp_list[n], n);
    }
  }

  for (int n = 0; n < n_tp; n++) {

    amrex::ParmParse pp("turbinflow." + tp_list[n]);
    if (pp.countval("turb_file") > 0) {

      // Query data
      pp.query("turb_file", tp[n].m_turb_file);
      tp[n].dir = -1;
      pp.query("dir", tp[n].dir);
      AMREX_ASSERT_WITH_MESSAGE(
        tp[n].dir >= 0 && tp[n].dir < AMREX_SPACEDIM,
        "Injection direction is needed: 0, 1 or 2");
      std::string side;
      pp.query("side", side);
      if (side == "low") {
        tp[n].side = amrex::Orientation::low;
      } else if (side == "high") {
        tp[n].side = amrex::Orientation::high;
      } else {
        amrex::Abort("turbinflow.side can only be low or high");
      }
      pp.query("time_offset", tp[n].time_shift);
      pp.query("turb_scale_loc", tp[n].turb_scale_loc);
      pp.query("turb_scale_vel", tp[n].turb_scale_vel);
      amrex::Print() << "Initializing turbInflow " << tp_list[n]
                     << " with file " << tp[n].m_turb_file
                     << " (location coordinates in will be scaled by "
                     << tp[n].turb_scale_loc
                     << " and velocity out to be scaled by "
                     << tp[n].turb_scale_vel << ") \n";

      // Get the turbcenter on the injection face
      amrex::Vector<amrex::Real> turb_center(AMREX_SPACEDIM - 1, 0);
      pp.getarr("turb_center", turb_center);
      AMREX_ASSERT_WITH_MESSAGE(
        turb_center.size() == AMREX_SPACEDIM - 1,
        "turb_center must have AMREX_SPACEDIM-1 elements");
      for (int idim = 0; idim < turb_center.size(); ++idim) {
        turb_center[idim] *= tp[n].turb_scale_loc;
      }

      pp.query("turb_nplane", tp[n].nplane);
      AMREX_ASSERT(tp[n].nplane > 0);
      pp.query("turb_conv_vel", tp[n].turb_conv_vel);
      AMREX_ASSERT(tp[n].turb_conv_vel > 0);

      // Set other stuff
      std::string turb_header = tp[n].m_turb_file + "/HDR";
      std::ifstream is(turb_header.c_str());
      if (!is.is_open()) {
        amrex::Abort("Unable to open input file " + turb_header);
      }
      amrex::Array<int, AMREX_SPACEDIM> npts = {{0}};
      amrex::Array<amrex::Real, AMREX_SPACEDIM> probsize = {{0}};
      amrex::Array<int, AMREX_SPACEDIM> iper = {{0}};
      is >> npts[0] >> npts[1] >> npts[2];
      is >> probsize[0] >> probsize[1] >> probsize[2];
      is >> iper[0] >> iper[1] >>
        iper[2]; // Unused - we assume it is always fully periodic

      for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        tp[n].dx[idim] = probsize[idim] / amrex::Real(npts[idim] - 1);
        tp[n].dxinv[idim] = 1.0 / tp[n].dx[idim];
      }

      // The following is relative to the injection face:
      // 0 and 1 are transverse directions, 2 is normal
      // one ghost point on each side, tangential to inflow face
      tp[n].pboxsize[0] = probsize[0] - 2.0 * tp[n].dx[0];
      tp[n].pboxsize[1] = probsize[1] - 2.0 * tp[n].dx[1];
      tp[n].pboxsize[2] = probsize[2];

      tp[n].npboxcells[0] = npts[0] - 3;
      tp[n].npboxcells[1] = npts[1] - 3;
      tp[n].npboxcells[2] = npts[2];

      // Center the turbulence
      tp[n].pboxlo[0] = turb_center[0] - 0.5 * tp[n].pboxsize[0];
      tp[n].pboxlo[1] = turb_center[1] - 0.5 * tp[n].pboxsize[1];
      tp[n].pboxlo[2] = 0.;

      amrex::Box sbx(
        amrex::IntVect(AMREX_D_DECL(1, 1, 1)),
        amrex::IntVect(AMREX_D_DECL(npts[0], npts[1], tp[n].nplane)));

      tp[n].sdata = new amrex::FArrayBox(sbx, 3, amrex::The_Async_Arena());

      tp[n].kmax = npts[2];

      if (tp[n].isswirltype) {
        for (int i = 0; i < tp[n].kmax; i++) {
          amrex::Real rdummy = 0.0;
          is >> rdummy; // Time for each plane - unused at the moment
        }
      }

      // Offset for each plane in Binary TurbFile
      tp[n].m_offset.resize(tp[n].kmax * AMREX_SPACEDIM);
      tp[n].offset = tp[n].m_offset.data();
      tp[n].offset_size = tp[n].m_offset.size();
      for (int i = 0; i < tp[n].offset_size; i++) {
        is >> tp[n].offset[i];
      }
      is.close();
    }
    turbinflow_initialized = true;
  }
}